

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier_test.cpp
# Opt level: O3

void __thiscall license::test::set_and_compare_data::test_method(set_and_compare_data *this)

{
  array<unsigned_char,_7UL> data;
  HwIdentifier pc_id;
  array<unsigned_char,_7UL> local_90;
  HwIdentifier local_88;
  undefined1 local_78;
  undefined8 local_70;
  shared_count sStack_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  undefined **local_30;
  undefined1 local_28;
  undefined1 *local_20;
  char *local_18;
  
  local_90._M_elems[0] = 0xff;
  local_90._M_elems[1] = 'B';
  local_90._M_elems[2] = 'B';
  local_90._M_elems[3] = 'B';
  local_90._M_elems[4] = 'B';
  local_90._M_elems[5] = 'B';
  local_90._M_elems[6] = 'B';
  hw_identifier::HwIdentifier::HwIdentifier(&local_88);
  hw_identifier::HwIdentifier::set_data(&local_88,&local_90);
  local_90._M_elems[0] = local_90._M_elems[0] & 0x1f;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/hw_identifier/hw_identifier_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x23);
  local_78 = hw_identifier::HwIdentifier::data_match(&local_88,&local_90);
  local_70 = 0;
  sStack_68.pi_ = (sp_counted_base *)0x0;
  local_28 = 0;
  local_30 = &PTR__lazy_ostream_001ab718;
  local_20 = boost::unit_test::lazy_ostream::inst;
  local_18 = "Data match";
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/hw_identifier/hw_identifier_test.cpp"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_68);
  hw_identifier::HwIdentifier::~HwIdentifier(&local_88);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(set_and_compare_data) {
	array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA> data = {0xFF, 0x42, 0x42, 0x42, 0x42, 0x42, 0x42};
	HwIdentifier pc_id;
	pc_id.set_data(data);
	data[0] = data[0] & 0x1f;
	BOOST_CHECK_MESSAGE(pc_id.data_match(data), "Data match");
}